

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::write_regular_image
          (mipmapped_texture *this,char *pFilename,uint32 image_write_flags)

{
  mipmapped_texture *in_RDI;
  image_u8 *pLevel_image;
  image_u8 tmp;
  int in_stack_00000138;
  uint in_stack_0000013c;
  image_u8 *in_stack_00000140;
  char *in_stack_00000148;
  undefined7 in_stack_ffffffffffffff78;
  image_u8 *img;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  image_u8 local_50;
  byte local_1;
  
  img = &local_50;
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x17380e);
  get_level_image((mipmapped_texture *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                  ,(uint)((ulong)in_stack_ffffffffffffff90 >> 0x20),(uint)in_stack_ffffffffffffff90,
                  img,(uint)((ulong)in_RDI >> 0x20));
  local_1 = image_utils::write_to_file
                      (in_stack_00000148,in_stack_00000140,in_stack_0000013c,in_stack_00000138);
  if (!(bool)local_1) {
    set_last_error(in_RDI,(char *)CONCAT17(local_1,in_stack_ffffffffffffff78));
  }
  image<crnlib::color_quad<unsigned_char,_int>_>::~image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x1738b9);
  return (bool)(local_1 & 1);
}

Assistant:

bool mipmapped_texture::write_regular_image(const char* pFilename, uint32 image_write_flags) {
  image_u8 tmp;
  image_u8* pLevel_image = get_level_image(0, 0, tmp);

  if (!image_utils::write_to_file(pFilename, *pLevel_image, image_write_flags)) {
    set_last_error("File write failed");
    return false;
  }

  return true;
}